

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_create_function
              (unqlite_vm *pVm,char *zName,
              _func_int_unqlite_context_ptr_int_unqlite_value_ptr_ptr *xFunc,void *pUserData)

{
  ushort **ppuVar1;
  bool bVar2;
  undefined1 auStack_40 [4];
  int rc;
  SyString sName;
  void *pUserData_local;
  _func_int_unqlite_context_ptr_int_unqlite_value_ptr_ptr *xFunc_local;
  char *zName_local;
  unqlite_vm *pVm_local;
  
  if ((pVm == (unqlite_vm *)0x0) || (pVm->nMagic == 0xdead2bad)) {
    pVm_local._4_4_ = -0x18;
  }
  else {
    _auStack_40 = (byte *)zName;
    sName._8_8_ = pUserData;
    sName.zString._0_4_ = SyStrlen(zName);
    while( true ) {
      bVar2 = false;
      if (((sxu32)sName.zString != 0) && (bVar2 = false, *_auStack_40 < 0xc0)) {
        ppuVar1 = __ctype_b_loc();
        bVar2 = ((*ppuVar1)[(int)(char)*_auStack_40] & 0x2000) != 0;
      }
      if (!bVar2) break;
      sName.zString._0_4_ = (sxu32)sName.zString - 1;
      _auStack_40 = _auStack_40 + 1;
    }
    while( true ) {
      bVar2 = false;
      if (((sxu32)sName.zString != 0) &&
         (bVar2 = false, _auStack_40[(sxu32)sName.zString - 1] < 0xc0)) {
        ppuVar1 = __ctype_b_loc();
        bVar2 = ((*ppuVar1)[(int)(char)_auStack_40[(sxu32)sName.zString - 1]] & 0x2000) != 0;
      }
      if (!bVar2) break;
      sName.zString._0_4_ = (sxu32)sName.zString - 1;
    }
    if (((sxu32)sName.zString == 0) ||
       (xFunc == (_func_int_unqlite_context_ptr_int_unqlite_value_ptr_ptr *)0x0)) {
      pVm_local._4_4_ = -9;
    }
    else {
      pVm_local._4_4_ =
           jx9VmInstallForeignFunction
                     (pVm->pJx9Vm,(SyString *)auStack_40,(ProcHostFunction)xFunc,(void *)sName._8_8_
                     );
    }
  }
  return pVm_local._4_4_;
}

Assistant:

int unqlite_create_function(unqlite_vm *pVm, const char *zName,int (*xFunc)(unqlite_context *,int,unqlite_value **),void *pUserData)
{
	SyString sName;
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
	SyStringInitFromBuf(&sName, zName, SyStrlen(zName));
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sName);
	/* Ticket 1433-003: NULL values are not allowed */
	if( sName.nByte < 1 || xFunc == 0 ){
		return UNQLITE_INVALID;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Install the foreign function */
	 rc = jx9VmInstallForeignFunction(pVm->pJx9Vm,&sName,xFunc,pUserData);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}